

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

unique_ptr<Transport,_std::default_delete<Transport>_>
MakeTransport(NodeId id,bool use_v2transport,bool inbound)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  _Head_base<0UL,_Transport_*,_false> in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  bVar2 = in_CL & 1;
  if (bVar3 == 0) {
    std::make_unique<V1Transport,long&>((long *)in_RDI._M_head_impl);
    std::unique_ptr<Transport,std::default_delete<Transport>>::
    unique_ptr<V1Transport,std::default_delete<V1Transport>,void>
              ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
               CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffffc8)),
               (unique_ptr<V1Transport,_std::default_delete<V1Transport>_> *)in_RDI._M_head_impl);
    std::unique_ptr<V1Transport,_std::default_delete<V1Transport>_>::~unique_ptr
              ((unique_ptr<V1Transport,_std::default_delete<V1Transport>_> *)
               CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffffc8)));
  }
  else {
    std::make_unique<V2Transport,long&,bool>
              ((long *)in_RDI._M_head_impl,
               (bool *)(CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffc8)) &
                       0x101ffffffffffff));
    std::unique_ptr<Transport,std::default_delete<Transport>>::
    unique_ptr<V2Transport,std::default_delete<V2Transport>,void>
              ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
               CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffffc8)),
               (unique_ptr<V2Transport,_std::default_delete<V2Transport>_> *)in_RDI._M_head_impl);
    std::unique_ptr<V2Transport,_std::default_delete<V2Transport>_>::~unique_ptr
              ((unique_ptr<V2Transport,_std::default_delete<V2Transport>_> *)
               CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffffc8)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Transport,_std::default_delete<Transport>,_true,_true>)
           (tuple<Transport_*,_std::default_delete<Transport>_>)in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<Transport> MakeTransport(NodeId id, bool use_v2transport, bool inbound) noexcept
{
    if (use_v2transport) {
        return std::make_unique<V2Transport>(id, /*initiating=*/!inbound);
    } else {
        return std::make_unique<V1Transport>(id);
    }
}